

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  HashMapStringKey *pHVar1;
  int iVar2;
  HLSL2GLSLConverterImpl *pHVar3;
  int iVar4;
  iterator *piVar5;
  iterator __position;
  __node_base_ptr p_Var6;
  _List_node_base *p_Var7;
  HLSLObjectInfo *pHVar8;
  const_iterator cVar9;
  int iVar10;
  bool bVar11;
  iterator Token;
  string err;
  Uint32 NumArguments;
  iterator OperationToken;
  iterator ArgsListEndToken;
  String *in_stack_ffffffffffffff48;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_b0;
  String local_a8;
  FunctionStubHashKey local_88;
  Uint32 local_5c;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_58;
  iterator *local_50;
  iterator local_48;
  TokenListType *local_40;
  iterator *local_38;
  
  local_b0._M_node = ScopeStart->_M_node;
  if (ScopeEnd->_M_node != local_b0._M_node) {
    local_40 = &this->m_Tokens;
    local_50 = ScopeEnd;
    local_38 = ScopeStart;
    do {
      if (*(int *)&local_b0._M_node[1]._M_next == 0x13b) {
        pHVar3 = this->m_Converter;
        HashMapStringKey::HashMapStringKey
                  (&local_88.Object,(Char *)local_b0._M_node[1]._M_prev,false);
        p_Var6 = std::
                 _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::_M_find_before_node
                           (&(pHVar3->m_AtomicOperations)._M_h,
                            (local_88.Object.Ownership_Hash & 0x7fffffffffffffff) %
                            (pHVar3->m_AtomicOperations)._M_h._M_bucket_count,&local_88.Object,
                            local_88.Object.Ownership_Hash & 0x7fffffffffffffff);
        if (p_Var6 == (__node_base_ptr)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = p_Var6->_M_nxt == (_Hash_node_base *)0x0;
        }
        pHVar1 = &local_88.Function;
        if ((local_88.Object.Str != (Char *)0x0) && ((long)local_88.Object.Ownership_Hash < 0)) {
          operator_delete__(local_88.Object.Str);
        }
        if (bVar11) goto LAB_0037ea30;
        local_58._M_node = local_b0._M_node;
        local_b0._M_node = (local_b0._M_node)->_M_next;
        if (local_b0._M_node == local_50->_M_node) {
          FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_a8,this,&local_b0,4);
          in_stack_ffffffffffffff48 = &local_a8;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8c4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x82ea05,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        if (*(int *)&local_b0._M_node[1]._M_next != 0x135) {
          FormatString<char[25]>((string *)&local_88,(char (*) [25])"Open bracket is expected");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_a8,this,&local_b0,4);
          in_stack_ffffffffffffff48 = &local_a8;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8c5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x82ea05,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        piVar5 = local_50;
        local_48._M_node = local_b0._M_node;
        local_5c = CountFunctionArguments(this,&local_48,local_50);
        p_Var7 = piVar5->_M_node;
        if (local_48._M_node == p_Var7) {
          FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_a8,this,&local_48,4);
          in_stack_ffffffffffffff48 = &local_a8;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8cc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x82ea05,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
          p_Var7 = local_50->_M_node;
        }
        local_b0._M_node = (local_b0._M_node)->_M_next;
        if (local_b0._M_node == p_Var7) {
          FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_a8,this,&local_b0,4);
          in_stack_ffffffffffffff48 = &local_a8;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8cf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x82ea05,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
        }
        pHVar8 = FindHLSLObject(this,(String *)&local_b0._M_node[1]._M_prev);
        pHVar3 = this->m_Converter;
        if (pHVar8 == (HLSLObjectInfo *)0x0) {
          FunctionStubHashKey::FunctionStubHashKey
                    (&local_88,"shared_var",(Char *)local_58._M_node[1]._M_prev,local_5c);
          cVar9 = std::
                  _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)pHVar3,&local_88);
          if ((local_88.Function.Str != (Char *)0x0) && ((long)local_88.Function.Ownership_Hash < 0)
             ) {
            operator_delete__(local_88.Function.Str);
          }
          local_88.Function.Str = (Char *)0x0;
          local_88.Function.Ownership_Hash = 0;
          if ((local_88.Object.Str != (Char *)0x0) && ((long)local_88.Object.Ownership_Hash < 0)) {
            operator_delete__(local_88.Object.Str);
          }
          if (cVar9.
              super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
              ._M_cur == (__node_type *)0x0) {
            FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                      ((string *)&local_88,(Diligent *)"Unable to find function stub for function ",
                       (char (*) [43])&local_58._M_node[1]._M_prev,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8f4e21
                       ,(char (*) [7])&local_5c,(uint *)0x8536df,
                       (char (*) [11])in_stack_ffffffffffffff48);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_a8,this,&local_58,4);
            in_stack_ffffffffffffff48 = &local_a8;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x909,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x82ea05,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
        }
        else {
          FunctionStubHashKey::FunctionStubHashKey
                    (&local_88,"image",(Char *)local_58._M_node[1]._M_prev,local_5c);
          cVar9 = std::
                  _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)pHVar3,&local_88);
          if ((local_88.Function.Str != (Char *)0x0) && ((long)local_88.Function.Ownership_Hash < 0)
             ) {
            operator_delete__(local_88.Function.Str);
          }
          local_88.Function.Str = (Char *)0x0;
          local_88.Function.Ownership_Hash = 0;
          if ((local_88.Object.Str != (Char *)0x0) && ((long)local_88.Object.Ownership_Hash < 0)) {
            operator_delete__(local_88.Object.Str);
          }
          if (cVar9.
              super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
              ._M_cur == (__node_type *)0x0) {
            FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                      ((string *)&local_88,(Diligent *)"Unable to find function stub for function ",
                       (char (*) [43])&local_58._M_node[1]._M_prev,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8f4e21
                       ,(char (*) [7])&local_5c,(uint *)0x8536df,
                       (char (*) [11])in_stack_ffffffffffffff48);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_a8,this,&local_58,4);
            in_stack_ffffffffffffff48 = &local_a8;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8d7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x82ea05,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          p_Var7 = local_50->_M_node;
          if (local_b0._M_node == p_Var7) {
LAB_0037ee52:
            FormatString<char[15]>((string *)&local_88,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_a8,this,&local_b0,4);
            in_stack_ffffffffffffff48 = &local_a8;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8ea,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x82ea05,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          else {
            iVar10 = 1;
            do {
              iVar2 = *(int *)&local_b0._M_node[1]._M_next;
              if ((iVar10 == 1) && ((iVar2 == 0x136 || (iVar2 == 0x13f)))) goto LAB_0037eedf;
              iVar4 = -(uint)(iVar2 == 0x136);
              if (iVar2 == 0x135) {
                iVar4 = 1;
              }
              local_b0._M_node = (local_b0._M_node)->_M_next;
            } while ((local_b0._M_node != p_Var7) && (iVar10 = iVar10 + iVar4, iVar10 != 0));
            if (local_b0._M_node == p_Var7) goto LAB_0037ee52;
          }
LAB_0037eedf:
          if (*(int *)&local_b0._M_node[1]._M_next != 0x13f) {
            FormatString<char[18]>((string *)&local_88,(char (*) [18])"Comma is expected");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_a8,this,&local_b0,4);
            in_stack_ffffffffffffff48 = &local_a8;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8eb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x82ea05,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          local_b0._M_node = (local_b0._M_node)->_M_prev;
          if (*(int *)&local_b0._M_node[1]._M_next != 0x138) {
            FormatString<char[13]>((string *)&local_88,(char (*) [13])"Expected \']\'");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_a8,this,&local_b0,4);
            in_stack_ffffffffffffff48 = &local_a8;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,(char (*) [2])0x82ea05,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
              operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
            }
          }
          __position._M_node = local_b0._M_node;
          local_b0._M_node = (local_b0._M_node)->_M_prev;
          std::__cxx11::
          list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
          ::_M_erase(local_40,__position);
          for (; local_b0._M_node != local_38->_M_node;
              local_b0._M_node = (local_b0._M_node)->_M_prev) {
            if (*(int *)&local_b0._M_node[1]._M_next == 0x137) goto LAB_0037f0e9;
          }
          FormatString<char[13]>((string *)&local_88,(char (*) [13])"Expected \'[\'");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_a8,this,&local_b0,4);
          in_stack_ffffffffffffff48 = &local_a8;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8fb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_88,(char (*) [2])0x82ea05,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((HashMapStringKey *)local_88.Object.Str != pHVar1) {
            operator_delete(local_88.Object.Str,(ulong)(local_88.Function.Str + 1));
          }
LAB_0037f0e9:
          *(undefined4 *)&local_b0._M_node[1]._M_next = 0x13f;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_b0._M_node[1]._M_prev,0,(char *)local_b0._M_node[2]._M_next,
                     0x853c4b);
        }
        std::__cxx11::string::_M_assign((string *)&local_58._M_node[1]._M_prev);
        local_b0._M_node = local_48._M_node;
      }
      else {
LAB_0037ea30:
        local_b0._M_node = (local_b0._M_node)->_M_next;
      }
    } while (local_b0._M_node != local_50->_M_node);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics(const TokenListType::iterator& ScopeStart,
                                                              const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            auto AtomicIt = m_Converter.m_AtomicOperations.find(Token->Literal.c_str());
            if (AtomicIt == m_Converter.m_AtomicOperations.end())
            {
                ++Token;
                continue;
            }

            auto OperationToken = Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            // ^
            ++Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            //               ^
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenParen, "Open bracket is expected");

            auto ArgsListEndToken = Token;
            auto NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);
            // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
            //                                           ^
            //                                       ArgsListEndToken
            VERIFY_PARSER_STATE(ArgsListEndToken, ArgsListEndToken != ScopeEnd, "Unexpected EOF");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");

            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo != nullptr)
            {
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("image", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");

                // Find first comma
                int NumOpenBrackets = 1;
                while (Token != ScopeEnd && NumOpenBrackets != 0)
                {
                    // Do not count arguments of nested functions:
                    if (NumOpenBrackets == 1 && (Token->Type == TokenType::Comma || Token->Type == TokenType::ClosingParen))
                        break;

                    if (Token->Type == TokenType::OpenParen)
                        ++NumOpenBrackets;
                    else if (Token->Type == TokenType::ClosingParen)
                        --NumOpenBrackets;

                    ++Token;
                }
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                              ^
                VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Comma, "Comma is expected");

                --Token;
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                             ^
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Expected \']\'");
                auto ClosingBracketToken = Token;
                --Token;
                m_Tokens.erase(ClosingBracketToken);
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                           ^
                while (Token != ScopeStart && Token->Type != TokenType::OpenSquareBracket)
                    --Token;
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                     ^

                VERIFY_PARSER_STATE(Token, Token != ScopeStart, "Expected \'[\'");
                Token->Type    = TokenType::Comma;
                Token->Literal = ",";
                // InterlockedAdd(Tex2D,GTid.xy, 1, iOldVal);
                //                     ^

                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddImage_3(Tex2D,GTid.xy, 1, iOldVal);
            }
            else
            {
                // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("shared_var", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");
                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddSharedVar_3(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            }
            Token = ArgsListEndToken;
        }
        else
            ++Token;
    }
}